

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frozen_benchmark.c
# Opt level: O2

void save(char *buf,size_t len)

{
  char *__filename;
  int __fd;
  ssize_t sVar1;
  FILE *__stream;
  size_t __size;
  void *__ptr;
  size_t sVar2;
  void *__ptr_00;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  char cVar6;
  byte bVar7;
  long extraout_RDX;
  ulong uVar8;
  uint uVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  
  uVar9 = 0x241;
  __fd = open("/tmp/roaring.bin",0x241,0x1b6);
  if (__fd != -1) {
    while( true ) {
      if (len == 0) {
        close(__fd);
        return;
      }
      pcVar10 = buf;
      sVar1 = write(__fd,buf,len);
      uVar9 = (uint)pcVar10;
      if (sVar1 == -1) break;
      buf = buf + sVar1;
      len = len - sVar1;
    }
    die("write");
  }
  pcVar10 = "open";
  die("open");
  if ((int)uVar9 < 1) {
    uVar9 = 0;
  }
  uVar13 = 0;
LAB_001013b2:
  uVar12 = 1;
  if (uVar13 == uVar9) {
    return;
  }
  __filename = *(char **)(extraout_RDX + uVar13 * 8);
  __stream = fopen(__filename,"r");
  if (__stream == (FILE *)0x0) {
    printf("Could not open file %s\n",__filename);
  }
  else {
    fseek(__stream,0,2);
    __size = ftell(__stream);
    rewind(__stream);
    __ptr = malloc(__size + 1);
    if (__ptr == (void *)0x0) {
      fclose(__stream);
    }
    else {
      sVar2 = fread(__ptr,__size,1,__stream);
      if (sVar2 == 1) {
        *(undefined1 *)((long)__ptr + __size) = 0;
        fclose(__stream);
        uVar11 = 0;
        do {
          if (*(char *)((long)__ptr + uVar11) == ',') {
            uVar12 = uVar12 + 1;
          }
          else if (*(char *)((long)__ptr + uVar11) == '\0') goto LAB_00101460;
          uVar11 = uVar11 + 1;
        } while( true );
      }
      free(__ptr);
    }
  }
  goto LAB_0010155f;
LAB_00101460:
  __ptr_00 = malloc(uVar12 * 4);
  if (__ptr_00 != (void *)0x0) {
    uVar8 = 0;
    uVar5 = 0;
    while ((uVar5 < uVar11 && (cVar6 = *(char *)((long)__ptr + uVar5), cVar6 != '\0'))) {
      uVar3 = uVar5 + 2;
      while ((byte)(cVar6 - 0x3aU) < 0xf6) {
        cVar6 = *(char *)((long)__ptr + uVar5 + 1);
        uVar5 = uVar5 + 1;
        uVar3 = uVar3 + 1;
        if (cVar6 == '\0') goto LAB_001014d4;
      }
      uVar4 = (uint)(byte)(cVar6 - 0x30);
      while (bVar7 = *(char *)((long)__ptr + (uVar3 - 1)) - 0x30, bVar7 < 10) {
        uVar4 = (uint)bVar7 + uVar4 * 10;
        uVar3 = uVar3 + 1;
      }
      *(uint *)((long)__ptr_00 + uVar8 * 4) = uVar4;
      uVar8 = uVar8 + 1;
      uVar5 = uVar3;
    }
LAB_001014d4:
    if (uVar8 != uVar12) {
      printf("unexpected number of integers! %d %d \n",uVar8 & 0xffffffff,uVar12 & 0xffffffff);
    }
    free(__ptr);
    if (uVar8 != 0) {
      for (uVar12 = 0; uVar8 != uVar12; uVar12 = uVar12 + 1) {
        roaring_bitmap_add((roaring_bitmap_t *)pcVar10,*(uint32_t *)((long)__ptr_00 + uVar12 * 4));
      }
      free(__ptr_00);
      uVar13 = uVar13 + 1;
      goto LAB_001013b2;
    }
  }
LAB_0010155f:
  fprintf(_stderr,"No integers found in %s\n",*(undefined8 *)(extraout_RDX + uVar13 * 8));
  exit(1);
}

Assistant:

void save(const char *buf, size_t len) {
    int fd = open(FILENAME, O_WRONLY | O_CREAT | O_TRUNC, 0666);
    if (fd == -1) {
        die("open");
    }
    while (len > 0) {
        ssize_t res = write(fd, buf, len);
        if (res == -1) {
            die("write");
        }
        buf += res;
        len -= res;
    }
    close(fd);
}